

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O2

void __thiscall fasttext::ProductQuantizer::save(ProductQuantizer *this,ostream *out)

{
  std::ostream::write((char *)out,(long)&this->dim_);
  std::ostream::write((char *)out,(long)&this->nsubq_);
  std::ostream::write((char *)out,(long)&this->dsub_);
  std::ostream::write((char *)out,(long)&this->lastdsub_);
  std::ostream::write((char *)out,
                      (long)(this->centroids_).super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void ProductQuantizer::save(std::ostream& out) const {
  out.write((char*)&dim_, sizeof(dim_));
  out.write((char*)&nsubq_, sizeof(nsubq_));
  out.write((char*)&dsub_, sizeof(dsub_));
  out.write((char*)&lastdsub_, sizeof(lastdsub_));
  out.write((char*)centroids_.data(), centroids_.size() * sizeof(real));
}